

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O0

bool __thiscall xray_re::xr_image::save_dds(xr_image *this,char *path,string *name,irect *rect)

{
  bool bVar1;
  xr_memory_writer *this_00;
  bool local_51;
  bool status;
  xr_memory_writer *w;
  irect *rect_local;
  string *name_local;
  char *path_local;
  xr_image *this_local;
  
  this_00 = (xr_memory_writer *)operator_new(0x2078);
  xr_memory_writer::xr_memory_writer(this_00);
  bVar1 = save_dds(this,(xr_writer *)this_00,rect);
  local_51 = false;
  if (bVar1) {
    local_51 = xr_memory_writer::save_to(this_00,path,name);
  }
  if (this_00 != (xr_memory_writer *)0x0) {
    (*(this_00->super_xr_writer)._vptr_xr_writer[1])();
  }
  return local_51;
}

Assistant:

bool xr_image::save_dds(const char* path, const std::string& name, const irect* rect) const
{
	xr_memory_writer* w = new xr_memory_writer();
	bool status = save_dds(*w, rect) && w->save_to(path, name);
	delete w;
	return status;
}